

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

size_t __thiscall v_array<node_pred>::unique_add_sorted(v_array<node_pred> *this,node_pred *new_ele)

{
  node_pred *pnVar1;
  node_pred *pnVar2;
  uint32_t uVar3;
  float fVar4;
  size_t sVar5;
  node_pred *pnVar6;
  long lVar7;
  
  pnVar1 = this->_end;
  pnVar2 = this->_begin;
  sVar5 = find_sorted(this,new_ele);
  pnVar6 = this->_begin;
  lVar7 = (long)this->_end - (long)pnVar6 >> 3;
  if ((sVar5 == lVar7 * -0x5555555555555555) || (pnVar6[sVar5].label != new_ele->label)) {
    if (this->_end == this->end_array) {
      resize(this,lVar7 * 0x5555555555555556 + 3);
      pnVar6 = this->_begin;
    }
    lVar7 = ((long)pnVar1 - (long)pnVar2 >> 3) * -0x5555555555555555 - sVar5;
    if (lVar7 != 0) {
      memmove(pnVar6 + sVar5 + 1,pnVar6 + sVar5,lVar7 * 0x18);
      pnVar6 = this->_begin;
    }
    uVar3 = new_ele->label_count;
    pnVar6[sVar5].label = new_ele->label;
    pnVar6[sVar5].label_count = uVar3;
    fVar4 = new_ele->norm_Ehk;
    uVar3 = new_ele->nk;
    pnVar6 = pnVar6 + sVar5;
    pnVar6->Ehk = new_ele->Ehk;
    pnVar6->norm_Ehk = fVar4;
    pnVar6->nk = uVar3;
    this->_end = this->_end + 1;
  }
  return sVar5;
}

Assistant:

size_t unique_add_sorted(const T& new_ele)
  {
    size_t index = 0;
    size_t size = _end - _begin;
    size_t to_move;

    if (!contain_sorted(new_ele, index))
    {
      if (_end == end_array)
        resize(2 * (end_array - _begin) + 3);

      to_move = size - index;

      if (to_move > 0)
        memmove(_begin + index + 1, _begin + index,
            to_move * sizeof(T));  // kopiuje to_move*.. bytow z _begin+index do _begin+index+1

      _begin[index] = new_ele;

      _end++;
    }

    return index;
  }